

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthogonal_states_test.cpp
# Opt level: O0

void __thiscall
afsm::test::OrthogonalRegions_Simple_Test::~OrthogonalRegions_Simple_Test
          (OrthogonalRegions_Simple_Test *this)

{
  OrthogonalRegions_Simple_Test *this_local;
  
  ~OrthogonalRegions_Simple_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OrthogonalRegions, Simple)
{
    ortho_fsm fsm;
    EXPECT_TRUE(done(fsm.process_event(events::power_on{})));
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work::state_a>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error::no>());

    EXPECT_TRUE(done(fsm.process_event(events::do_work{})));
    EXPECT_TRUE(done(fsm.process_event(events::error{})));
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work::state_b>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error::yes>());

    EXPECT_TRUE(done(fsm.process_event(events::do_work{})));
    EXPECT_TRUE(done(fsm.process_event(events::error{})));
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::work::state_a>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error>());
    EXPECT_TRUE(fsm.is_in_state<ortho_fsm::on::error::yes>());
}